

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocumentlayout.cpp
# Opt level: O3

QFixed flowPosition(iterator *it)

{
  QTextFrame *this;
  int iVar1;
  QTextFrameLayoutData *data;
  long lVar2;
  QTextLayout *this_00;
  long in_FS_OFFSET;
  qreal qVar3;
  double dVar4;
  QTextLine QVar5;
  QPointF QVar6;
  QTextLine local_48;
  undefined1 local_38 [24];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this = it->cf;
  if ((this != (QTextFrame *)0x0) || (iVar1 = 0, it->cb != it->e)) {
    if (this == (QTextFrame *)0x0) {
      local_38._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QTextFrame::iterator::currentBlock(it);
      this_00 = QTextBlock::layout((QTextBlock *)local_38);
      iVar1 = QTextLayout::lineCount(this_00);
      QVar6 = QTextLayout::position(this_00);
      dVar4 = QVar6.yp;
      if (iVar1 != 0) {
        QVar5 = QTextLayout::lineAt(this_00,0);
        local_48.eng = QVar5.eng;
        local_48.index = QVar5.index;
        qVar3 = QTextLine::y(&local_48);
        dVar4 = dVar4 + qVar3;
      }
      iVar1 = (int)(dVar4 * 64.0);
    }
    else {
      data = QTextFrame::layoutData(this);
      if (data == (QTextFrameLayoutData *)0x0) {
        lVar2 = QMetaObject::cast((QObject *)&QTextTable::staticMetaObject);
        if (lVar2 == 0) {
          data = (QTextFrameLayoutData *)operator_new(0x78);
          data->_vptr_QTextFrameLayoutData = (_func_int **)&PTR__QTextFrameData_007dcf10;
          data[1]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          data[2]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          data[3]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          data[4]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          data[5]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          data[6]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          data[7]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          data[8]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          *(undefined4 *)&data[9]._vptr_QTextFrameLayoutData = 0x1fffffc0;
          data[10]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          *(undefined2 *)&data[0xb]._vptr_QTextFrameLayoutData = 0x101;
          data[0xc]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          data[0xd]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          data[0xe]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
        }
        else {
          data = (QTextFrameLayoutData *)operator_new(0x160);
          data[1]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          data[2]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          data[3]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          data[4]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          data[5]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          data[6]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          data[7]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          data[8]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          *(undefined4 *)&data[9]._vptr_QTextFrameLayoutData = 0x1fffffc0;
          data[10]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          *(undefined2 *)&data[0xb]._vptr_QTextFrameLayoutData = 0x101;
          data[0xc]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          data[0xd]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          data[0xe]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          data[0xf]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          data->_vptr_QTextFrameLayoutData = (_func_int **)&PTR__QTextTableData_007dd0c0;
          data[0x2a]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          data[0x2b]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          memset(data + 0x11,0,0xc0);
        }
        QTextFrame::setLayoutData(this,data);
      }
      iVar1 = *(int *)((long)&data[1]._vptr_QTextFrameLayoutData + 4);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (QFixed)iVar1;
  }
  __stack_chk_fail();
}

Assistant:

static QFixed flowPosition(const QTextFrame::iterator &it)
{
    if (it.atEnd())
        return 0;

    if (it.currentFrame()) {
        return data(it.currentFrame())->position.y;
    } else {
        QTextBlock block = it.currentBlock();
        QTextLayout *layout = block.layout();
        if (layout->lineCount() == 0)
            return QFixed::fromReal(layout->position().y());
        else
            return QFixed::fromReal(layout->position().y() + layout->lineAt(0).y());
    }
}